

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_comment(xml_buffered_writer *writer,char_t *s)

{
  byte bVar1;
  char_t *data;
  char_t *__n;
  bool bVar2;
  char_t *prev;
  char_t *s_local;
  xml_buffered_writer *writer_local;
  
  xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
  prev = s;
  while( true ) {
    do {
      data = prev;
      if (*prev == '\0') {
        xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
        return;
      }
      while( true ) {
        bVar2 = false;
        __n = prev;
        if (*prev != '\0') {
          bVar1 = *prev;
          bVar2 = false;
          if (bVar1 == 0x2d) {
            bVar1 = prev[1];
            bVar2 = true;
            if (bVar1 != 0x2d) {
              bVar2 = prev[1] == '\0';
            }
          }
          __n = (char_t *)(ulong)bVar1;
          bVar2 = (bool)(bVar2 ^ 1);
        }
        if (!bVar2) break;
        prev = prev + 1;
      }
      xml_buffered_writer::write_buffer(writer,data,(long)prev - (long)data);
    } while (*prev == '\0');
    if (*prev != '-') break;
    xml_buffered_writer::write(writer,0x2d,(void *)0x20,(size_t)__n);
    prev = prev + 1;
  }
  __assert_fail("*s == \'-\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0xfcb,
                "void pugi::impl::(anonymous namespace)::node_output_comment(xml_buffered_writer &, const char_t *)"
               );
}

Assistant:

PUGI__FN void node_output_comment(xml_buffered_writer& writer, const char_t* s)
	{
		writer.write('<', '!', '-', '-');

		while (*s)
		{
			const char_t* prev = s;

			// look for -\0 or -- sequence - we can't output it since -- is illegal in comment body
			while (*s && !(s[0] == '-' && (s[1] == '-' || s[1] == 0))) ++s;

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			if (*s)
			{
				assert(*s == '-');

				writer.write('-', ' ');
				++s;
			}
		}

		writer.write('-', '-', '>');
	}